

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow(bool *p_open)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImVec2 this;
  ImVector<ImGuiWindow_*> *this_00;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ImGuiWindow *pIVar7;
  char *pcVar8;
  ImRect *pIVar9;
  ImDrawList *pIVar10;
  ImGuiViewportP **ppIVar11;
  ImDrawList **ppIVar12;
  ImGuiPopupData *pIVar13;
  ImGuiSettingsHandler *pIVar14;
  ImGuiWindow **ppIVar15;
  ImGuiTable *table_00;
  float fVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  float local_530;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_488;
  undefined1 local_34c [8];
  ImRect r_5;
  float thickness;
  ImU32 col;
  ImRect r_4;
  int column_n_1;
  ImDrawList *draw_list_1;
  ImGuiTable *table_2;
  int table_n_1;
  ImVec2 local_304;
  float local_2fc;
  char local_2f8 [4];
  float font_size;
  char buf_2 [32];
  undefined1 local_2d0 [8];
  ImRect r_3;
  ImDrawList *draw_list;
  ImGuiWindow *window_1;
  int local_2a8;
  int n_4;
  int n_3;
  int active_id_using_key_input_count;
  ImGuiTableSettings *local_298;
  ImGuiTableSettings *settings_1;
  ImGuiWindowSettings *settings;
  ImFontAtlas *pIStack_280;
  int n_2;
  ImFontAtlas *atlas;
  ImGuiTable *table_1;
  ImGuiTabBar *pIStack_268;
  int n_1;
  ImGuiTabBar *tab_bar;
  ImGuiWindow *pIStack_258;
  int n;
  ImGuiWindow *window;
  int i_2;
  int i_1;
  int draw_list_i;
  int layer_i;
  ImGuiViewportP *viewport;
  int viewport_i_1;
  int viewport_i;
  int drawlist_count;
  int i;
  ImVector<ImGuiWindow_*> *temp_buffer;
  ImVec2 local_218;
  ImVec2 local_210;
  ImVec2 local_208;
  ImVec2 local_200;
  undefined1 local_1f8 [8];
  ImRect r_2;
  ImVec2 local_1e0;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  ImVec2 local_1c8;
  undefined1 local_1c0 [8];
  ImRect r_1;
  int column_n;
  int rect_n_1;
  char buf_1 [128];
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImGuiTable *local_100;
  ImGuiTable *table;
  undefined1 auStack_f0 [4];
  int table_n;
  ImRect r;
  int rect_n;
  bool show_encoding_viewer;
  char *trt_rects_names [13];
  char *local_68;
  char *wrt_rects_names [8];
  ImGuiMetricsConfig *cfg;
  ImGuiIO *io;
  ImGuiContext *g;
  bool *p_open_local;
  
  pIVar2 = GImGui;
  wrt_rects_names[7] = &(GImGui->DebugMetricsConfig).ShowDebugLog;
  if ((((ImGuiMetricsConfig *)wrt_rects_names[7])->ShowDebugLog & 1U) != 0) {
    ShowDebugLogWindow((bool *)wrt_rects_names[7]);
  }
  if ((wrt_rects_names[7][1] & 1U) != 0) {
    ShowStackToolWindow((bool *)(wrt_rects_names[7] + 1));
  }
  bVar3 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  if ((bVar3) && (pIVar7 = GetCurrentWindow(), pIVar7->BeginCount < 2)) {
    pcVar8 = GetVersion();
    Text("Dear ImGui %s",pcVar8);
    Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / (pIVar2->IO).Framerate),
         (double)(pIVar2->IO).Framerate);
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar2->IO).MetricsRenderVertices,
         (ulong)(uint)(pIVar2->IO).MetricsRenderIndices);
    Text("%d visible windows, %d active allocations",(ulong)(uint)(pIVar2->IO).MetricsRenderWindows,
         (ulong)(uint)(pIVar2->IO).MetricsActiveAllocations);
    Separator();
    memcpy(&local_68,&PTR_anon_var_dwarf_a1052_002612d0,0x40);
    memcpy(&rect_n,&PTR_anon_var_dwarf_a1052_00261310,0x68);
    if (*(int *)(wrt_rects_names[7] + 8) < 0) {
      wrt_rects_names[7][8] = '\x04';
      wrt_rects_names[7][9] = '\0';
      wrt_rects_names[7][10] = '\0';
      wrt_rects_names[7][0xb] = '\0';
    }
    if (*(int *)(wrt_rects_names[7] + 0xc) < 0) {
      wrt_rects_names[7][0xc] = '\x02';
      wrt_rects_names[7][0xd] = '\0';
      wrt_rects_names[7][0xe] = '\0';
      wrt_rects_names[7][0xf] = '\0';
    }
    bVar3 = TreeNode("Tools");
    if (bVar3) {
      r.Max.y._3_1_ = TreeNode("UTF-8 Encoding viewer");
      SameLine(0.0,-1.0);
      MetricsHelpMarker(
                       "You can also call ImGui::DebugTextEncoding() from your code with a given string to test that your UTF-8 encoding settings are correct."
                       );
      if ((r.Max.y._3_1_ & 1) != 0) {
        SetNextItemWidth(-1.1754944e-38);
        InputText("##Text",ShowMetricsWindow::buf,100,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        if (ShowMetricsWindow::buf[0] != '\0') {
          DebugTextEncoding(ShowMetricsWindow::buf);
        }
        TreePop();
      }
      bVar3 = Checkbox("Show Item Picker",&pIVar2->DebugItemPickerActive);
      if ((bVar3) && ((pIVar2->DebugItemPickerActive & 1U) != 0)) {
        DebugStartItemPicker();
      }
      SameLine(0.0,-1.0);
      MetricsHelpMarker(
                       "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                       );
      Checkbox("Show Debug Log",(bool *)wrt_rects_names[7]);
      SameLine(0.0,-1.0);
      MetricsHelpMarker("You can also call ImGui::ShowDebugLogWindow() from your code.");
      Checkbox("Show Stack Tool",(bool *)(wrt_rects_names[7] + 1));
      SameLine(0.0,-1.0);
      MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");
      Checkbox("Show windows begin order",(bool *)(wrt_rects_names[7] + 3));
      Checkbox("Show windows rectangles",(bool *)(wrt_rects_names[7] + 2));
      SameLine(0.0,-1.0);
      fVar17 = GetFontSize();
      SetNextItemWidth(fVar17 * 12.0);
      bVar3 = Combo("##show_windows_rect_type",(int *)(wrt_rects_names[7] + 8),&local_68,8,8);
      wrt_rects_names[7][2] = (wrt_rects_names[7][2] & 1U) != 0 || bVar3;
      if (((wrt_rects_names[7][2] & 1U) != 0) && (pIVar2->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",pIVar2->NavWindow->Name);
        Indent(0.0);
        for (r.Max.x = 0.0; (int)r.Max.x < 8; r.Max.x = (float)((int)r.Max.x + 1)) {
          _auStack_f0 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar2->NavWindow,(int)r.Max.x);
          dVar18 = (double)(float)auStack_f0;
          dVar19 = (double)(float)table_n;
          dVar20 = (double)r.Min.x;
          dVar21 = (double)r.Min.y;
          fVar17 = ImRect::GetWidth((ImRect *)auStack_f0);
          fVar16 = ImRect::GetHeight((ImRect *)auStack_f0);
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",dVar18,dVar19,dVar20,dVar21,
               (double)fVar17,(double)fVar16,wrt_rects_names[(long)(int)r.Max.x + -1]);
        }
        Unindent(0.0);
      }
      Checkbox("Show tables rectangles",(bool *)(wrt_rects_names[7] + 4));
      SameLine(0.0,-1.0);
      fVar17 = GetFontSize();
      SetNextItemWidth(fVar17 * 12.0);
      bVar3 = Combo("##show_table_rects_type",(int *)(wrt_rects_names[7] + 0xc),(char **)&rect_n,0xd
                    ,0xd);
      wrt_rects_names[7][4] = (wrt_rects_names[7][4] & 1U) != 0 || bVar3;
      if (((wrt_rects_names[7][4] & 1U) != 0) && (pIVar2->NavWindow != (ImGuiWindow *)0x0)) {
        for (table._4_4_ = 0; iVar4 = table._4_4_,
            iVar6 = ImPool<ImGuiTable>::GetMapSize(&pIVar2->Tables), iVar4 < iVar6;
            table._4_4_ = table._4_4_ + 1) {
          local_100 = ImPool<ImGuiTable>::TryGetMapData(&pIVar2->Tables,table._4_4_);
          if (((local_100 != (ImGuiTable *)0x0) &&
              (pIVar2->FrameCount + -1 <= local_100->LastFrameActive)) &&
             ((local_100->OuterWindow == pIVar2->NavWindow ||
              (local_100->InnerWindow == pIVar2->NavWindow)))) {
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)local_100->ID,
                       (ulong)(uint)local_100->ColumnsCount,local_100->OuterWindow->Name);
            bVar3 = IsItemHovered(0);
            if (bVar3) {
              pIVar10 = GetForegroundDrawList();
              pIVar9 = &local_100->OuterRect;
              ImVec2::ImVec2(&local_110,1.0,1.0);
              local_108 = ::operator-(&pIVar9->Min,&local_110);
              pIVar9 = &local_100->OuterRect;
              ImVec2::ImVec2(&local_120,1.0,1.0);
              local_118 = operator+(&pIVar9->Max,&local_120);
              ImDrawList::AddRect(pIVar10,&local_108,&local_118,0xff00ffff,0.0,0,2.0);
            }
            Indent(0.0);
            for (r_1.Max.y = 0.0; (int)r_1.Max.y < 0xd; r_1.Max.y = (float)((int)r_1.Max.y + 1)) {
              if ((int)r_1.Max.y < 6) {
                _local_1f8 = ShowMetricsWindow::Funcs::GetTableRect(local_100,(int)r_1.Max.y,-1);
                dVar18 = (double)(float)local_1f8._0_4_;
                dVar19 = (double)(float)local_1f8._4_4_;
                dVar20 = (double)r_2.Min.x;
                dVar21 = (double)r_2.Min.y;
                fVar17 = ImRect::GetWidth((ImRect *)local_1f8);
                fVar16 = ImRect::GetHeight((ImRect *)local_1f8);
                ImFormatString((char *)&column_n,0x80,
                               "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",dVar18,dVar19,
                               dVar20,dVar21,(double)fVar17,(double)fVar16,
                               *(undefined8 *)(&rect_n + (long)(int)r_1.Max.y * 2));
                ImVec2::ImVec2(&local_200,0.0,0.0);
                Selectable((char *)&column_n,false,0,&local_200);
                bVar3 = IsItemHovered(0);
                if (bVar3) {
                  pIVar10 = GetForegroundDrawList();
                  ImVec2::ImVec2(&local_210,1.0,1.0);
                  local_208 = ::operator-((ImVec2 *)local_1f8,&local_210);
                  ImVec2::ImVec2((ImVec2 *)&temp_buffer,1.0,1.0);
                  local_218 = operator+(&r_2.Min,(ImVec2 *)&temp_buffer);
                  ImDrawList::AddRect(pIVar10,&local_208,&local_218,0xff00ffff,0.0,0,2.0);
                }
              }
              else if ((r_1.Max.y == 8.40779e-45) || (r_1.Max.y == 1.12104e-44)) {
                for (r_1.Max.x = 0.0; (int)r_1.Max.x < local_100->ColumnsCount;
                    r_1.Max.x = (float)((int)r_1.Max.x + 1)) {
                  _local_1c0 = ShowMetricsWindow::Funcs::GetTableRect
                                         (local_100,(int)r_1.Max.y,(int)r_1.Max.x);
                  dVar18 = (double)(float)local_1c0._0_4_;
                  dVar19 = (double)(float)local_1c0._4_4_;
                  dVar20 = (double)r_1.Min.x;
                  dVar21 = (double)r_1.Min.y;
                  fVar17 = ImRect::GetWidth((ImRect *)local_1c0);
                  fVar16 = ImRect::GetHeight((ImRect *)local_1c0);
                  ImFormatString((char *)&column_n,0x80,
                                 "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",dVar18,
                                 dVar19,dVar20,dVar21,(double)fVar17,(double)fVar16,
                                 (ulong)(uint)r_1.Max.x);
                  ImVec2::ImVec2(&local_1c8,0.0,0.0);
                  Selectable((char *)&column_n,false,0,&local_1c8);
                  bVar3 = IsItemHovered(0);
                  if (bVar3) {
                    pIVar10 = GetForegroundDrawList();
                    ImVec2::ImVec2(&local_1d8,1.0,1.0);
                    local_1d0 = ::operator-((ImVec2 *)local_1c0,&local_1d8);
                    ImVec2::ImVec2(&r_2.Max,1.0,1.0);
                    local_1e0 = operator+(&r_1.Min,&r_2.Max);
                    ImDrawList::AddRect(pIVar10,&local_1d0,&local_1e0,0xff00ffff,0.0,0,2.0);
                  }
                }
              }
            }
            Unindent(0.0);
          }
        }
      }
      TreePop();
    }
    bVar3 = TreeNode("Windows","Windows (%d)",(ulong)(uint)(pIVar2->Windows).Size);
    if (bVar3) {
      DebugNodeWindowsList(&pIVar2->Windows,"By display order");
      DebugNodeWindowsList(&pIVar2->WindowsFocusOrder,"By focus order (root windows)");
      bVar3 = TreeNode("By submission order (begin stack)");
      if (bVar3) {
        _drawlist_count = &pIVar2->WindowsTempSortBuffer;
        ImVector<ImGuiWindow_*>::resize(_drawlist_count,0);
        for (viewport_i = 0; viewport_i < (pIVar2->Windows).Size; viewport_i = viewport_i + 1) {
          ppIVar15 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->Windows,viewport_i);
          this_00 = _drawlist_count;
          if (pIVar2->FrameCount <= (*ppIVar15)->LastFrameActive + 1) {
            ppIVar15 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->Windows,viewport_i);
            ImVector<ImGuiWindow_*>::push_back(this_00,ppIVar15);
          }
        }
        ImQsort(_drawlist_count->Data,(long)_drawlist_count->Size,8,
                ShowMetricsWindow::Func::WindowComparerByBeginOrder);
        DebugNodeWindowsListByBeginStackParent
                  (_drawlist_count->Data,_drawlist_count->Size,(ImGuiWindow *)0x0);
        TreePop();
      }
      TreePop();
    }
    viewport_i_1 = 0;
    for (viewport._4_4_ = 0; viewport._4_4_ < (pIVar2->Viewports).Size;
        viewport._4_4_ = viewport._4_4_ + 1) {
      ppIVar11 = ImVector<ImGuiViewportP_*>::operator[](&pIVar2->Viewports,viewport._4_4_);
      iVar4 = ImDrawDataBuilder::GetDrawListCount(&(*ppIVar11)->DrawDataBuilder);
      viewport_i_1 = iVar4 + viewport_i_1;
    }
    bVar3 = TreeNode("DrawLists","DrawLists (%d)",(ulong)(uint)viewport_i_1);
    if (bVar3) {
      Checkbox("Show ImDrawCmd mesh when hovering",(bool *)(wrt_rects_names[7] + 5));
      Checkbox("Show ImDrawCmd bounding boxes when hovering",(bool *)(wrt_rects_names[7] + 6));
      for (viewport._0_4_ = 0; (int)viewport < (pIVar2->Viewports).Size;
          viewport._0_4_ = (int)viewport + 1) {
        ppIVar11 = ImVector<ImGuiViewportP_*>::operator[](&pIVar2->Viewports,(int)viewport);
        _draw_list_i = *ppIVar11;
        for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
          for (i_2 = 0; i_2 < (_draw_list_i->DrawDataBuilder).Layers[i_1].Size; i_2 = i_2 + 1) {
            ppIVar12 = ImVector<ImDrawList_*>::operator[]
                                 ((_draw_list_i->DrawDataBuilder).Layers + i_1,i_2);
            DebugNodeDrawList((ImGuiWindow *)0x0,*ppIVar12,"DrawList");
          }
        }
      }
      TreePop();
    }
    bVar3 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar2->Viewports).Size);
    if (bVar3) {
      fVar17 = GetTreeNodeToLabelSpacing();
      Indent(fVar17);
      RenderViewportsThumbnails();
      fVar17 = GetTreeNodeToLabelSpacing();
      Unindent(fVar17);
      for (window._4_4_ = 0; window._4_4_ < (pIVar2->Viewports).Size;
          window._4_4_ = window._4_4_ + 1) {
        ppIVar11 = ImVector<ImGuiViewportP_*>::operator[](&pIVar2->Viewports,window._4_4_);
        DebugNodeViewport(*ppIVar11);
      }
      TreePop();
    }
    bVar3 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar2->OpenPopupStack).Size);
    if (bVar3) {
      for (window._0_4_ = 0; (int)window < (pIVar2->OpenPopupStack).Size;
          window._0_4_ = (int)window + 1) {
        pIVar13 = ImVector<ImGuiPopupData>::operator[](&pIVar2->OpenPopupStack,(int)window);
        pIStack_258 = pIVar13->Window;
        pIVar13 = ImVector<ImGuiPopupData>::operator[](&pIVar2->OpenPopupStack,(int)window);
        if (pIStack_258 == (ImGuiWindow *)0x0) {
          local_488 = "NULL";
        }
        else {
          local_488 = pIStack_258->Name;
        }
        bVar3 = false;
        if (pIStack_258 != (ImGuiWindow *)0x0) {
          bVar3 = (pIStack_258->Flags & 0x1000000U) != 0;
        }
        pcVar8 = "";
        if (bVar3) {
          pcVar8 = " ChildWindow";
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar13->PopupId,local_488,pcVar8);
      }
      TreePop();
    }
    uVar5 = ImPool<ImGuiTabBar>::GetAliveCount(&pIVar2->TabBars);
    bVar3 = TreeNode("TabBars","Tab Bars (%d)",(ulong)uVar5);
    if (bVar3) {
      for (tab_bar._4_4_ = 0; iVar4 = tab_bar._4_4_,
          iVar6 = ImPool<ImGuiTabBar>::GetMapSize(&pIVar2->TabBars), iVar4 < iVar6;
          tab_bar._4_4_ = tab_bar._4_4_ + 1) {
        pIStack_268 = ImPool<ImGuiTabBar>::TryGetMapData(&pIVar2->TabBars,tab_bar._4_4_);
        if (pIStack_268 != (ImGuiTabBar *)0x0) {
          PushID(pIStack_268);
          DebugNodeTabBar(pIStack_268,"TabBar");
          PopID();
        }
      }
      TreePop();
    }
    uVar5 = ImPool<ImGuiTable>::GetAliveCount(&pIVar2->Tables);
    bVar3 = TreeNode("Tables","Tables (%d)",(ulong)uVar5);
    if (bVar3) {
      for (table_1._4_4_ = 0; iVar4 = table_1._4_4_,
          iVar6 = ImPool<ImGuiTable>::GetMapSize(&pIVar2->Tables), iVar4 < iVar6;
          table_1._4_4_ = table_1._4_4_ + 1) {
        atlas = (ImFontAtlas *)ImPool<ImGuiTable>::TryGetMapData(&pIVar2->Tables,table_1._4_4_);
        if (atlas != (ImFontAtlas *)0x0) {
          DebugNodeTable((ImGuiTable *)atlas);
        }
      }
      TreePop();
    }
    pIStack_280 = (pIVar2->IO).Fonts;
    bVar3 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(pIStack_280->Fonts).Size);
    if (bVar3) {
      ShowFontAtlas(pIStack_280);
      TreePop();
    }
    bVar3 = TreeNode("InputText");
    if (bVar3) {
      DebugNodeInputTextState(&pIVar2->InputTextState);
      TreePop();
    }
    bVar3 = TreeNode("Settings");
    if (bVar3) {
      bVar3 = SmallButton("Clear");
      if (bVar3) {
        ClearIniSettings();
      }
      SameLine(0.0,-1.0);
      bVar3 = SmallButton("Save to memory");
      if (bVar3) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      SameLine(0.0,-1.0);
      bVar3 = SmallButton("Save to disk");
      if (bVar3) {
        SaveIniSettingsToDisk((pIVar2->IO).IniFilename);
      }
      SameLine(0.0,-1.0);
      if ((pIVar2->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"",(pIVar2->IO).IniFilename);
      }
      Text("SettingsDirtyTimer %.2f",(double)pIVar2->SettingsDirtyTimer);
      bVar3 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                       (ulong)(uint)(pIVar2->SettingsHandlers).Size);
      if (bVar3) {
        for (settings._4_4_ = 0; settings._4_4_ < (pIVar2->SettingsHandlers).Size;
            settings._4_4_ = settings._4_4_ + 1) {
          pIVar14 = ImVector<ImGuiSettingsHandler>::operator[]
                              (&pIVar2->SettingsHandlers,settings._4_4_);
          BulletText("%s",pIVar14->TypeName);
        }
        TreePop();
      }
      uVar5 = ImChunkStream<ImGuiWindowSettings>::size(&pIVar2->SettingsWindows);
      bVar3 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",(ulong)uVar5);
      if (bVar3) {
        for (settings_1 = (ImGuiTableSettings *)
                          ImChunkStream<ImGuiWindowSettings>::begin(&pIVar2->SettingsWindows);
            settings_1 != (ImGuiTableSettings *)0x0;
            settings_1 = (ImGuiTableSettings *)
                         ImChunkStream<ImGuiWindowSettings>::next_chunk
                                   (&pIVar2->SettingsWindows,(ImGuiWindowSettings *)settings_1)) {
          DebugNodeWindowSettings((ImGuiWindowSettings *)settings_1);
        }
        TreePop();
      }
      uVar5 = ImChunkStream<ImGuiTableSettings>::size(&pIVar2->SettingsTables);
      bVar3 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",(ulong)uVar5);
      if (bVar3) {
        for (local_298 = ImChunkStream<ImGuiTableSettings>::begin(&pIVar2->SettingsTables);
            local_298 != (ImGuiTableSettings *)0x0;
            local_298 = ImChunkStream<ImGuiTableSettings>::next_chunk
                                  (&pIVar2->SettingsTables,local_298)) {
          DebugNodeTableSettings(local_298);
        }
        TreePop();
      }
      uVar5 = ImGuiTextBuffer::size(&pIVar2->SettingsIniData);
      bVar3 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",(ulong)uVar5);
      if (bVar3) {
        pcVar8 = ImGuiTextBuffer::c_str(&pIVar2->SettingsIniData);
        iVar4 = (pIVar2->SettingsIniData).Buf.Size;
        fVar17 = GetTextLineHeight();
        ImVec2::ImVec2((ImVec2 *)&n_3,-1.1754944e-38,fVar17 * 20.0);
        InputTextMultiline("##Ini",pcVar8,(long)iVar4,(ImVec2 *)&n_3,0x4000,
                           (ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar3 = TreeNode("Internal state");
    if (bVar3) {
      Text("WINDOWING");
      Indent(0.0);
      if (pIVar2->HoveredWindow == (ImGuiWindow *)0x0) {
        local_4c8 = "NULL";
      }
      else {
        local_4c8 = pIVar2->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",local_4c8);
      if (pIVar2->HoveredWindow == (ImGuiWindow *)0x0) {
        local_4d0 = "NULL";
      }
      else {
        local_4d0 = pIVar2->HoveredWindow->RootWindow->Name;
      }
      Text("HoveredWindow->Root: \'%s\'",local_4d0);
      if (pIVar2->HoveredWindowUnderMovingWindow == (ImGuiWindow *)0x0) {
        local_4d8 = "NULL";
      }
      else {
        local_4d8 = pIVar2->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",local_4d8);
      if (pIVar2->MovingWindow == (ImGuiWindow *)0x0) {
        local_4e0 = "NULL";
      }
      else {
        local_4e0 = pIVar2->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",local_4e0);
      Unindent(0.0);
      Text("ITEMS");
      Indent(0.0);
      uVar5 = pIVar2->ActiveId;
      uVar1 = pIVar2->ActiveIdPreviousFrame;
      fVar17 = pIVar2->ActiveIdTimer;
      bVar3 = pIVar2->ActiveIdAllowOverlap;
      pcVar8 = GetInputSourceName(pIVar2->ActiveIdSource);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",(double)fVar17,
           (ulong)uVar5,(ulong)uVar1,(ulong)(bVar3 & 1),pcVar8);
      if (pIVar2->ActiveIdWindow == (ImGuiWindow *)0x0) {
        local_500 = "NULL";
      }
      else {
        local_500 = pIVar2->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",local_500);
      n_4 = 0;
      for (local_2a8 = 0x200; local_2a8 < 0x285; local_2a8 = local_2a8 + 1) {
        bVar3 = ImBitArray<133,_-512>::operator[](&pIVar2->ActiveIdUsingKeyInputMask,local_2a8);
        n_4 = (uint)bVar3 + n_4;
      }
      Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)",
           (ulong)(pIVar2->ActiveIdUsingMouseWheel & 1),(ulong)pIVar2->ActiveIdUsingNavDirMask,
           (ulong)pIVar2->ActiveIdUsingNavInputMask,(ulong)(uint)n_4);
      Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d",(double)pIVar2->HoveredIdTimer,
           (ulong)pIVar2->HoveredIdPreviousFrame,(ulong)(pIVar2->HoveredIdAllowOverlap & 1));
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)(pIVar2->DragDropActive & 1),(ulong)(pIVar2->DragDropPayload).SourceId,
           (pIVar2->DragDropPayload).DataType,(ulong)(uint)(pIVar2->DragDropPayload).DataSize);
      Unindent(0.0);
      Text("NAV,FOCUS");
      Indent(0.0);
      if (pIVar2->NavWindow == (ImGuiWindow *)0x0) {
        local_508 = "NULL";
      }
      else {
        local_508 = pIVar2->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",local_508);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar2->NavId,(ulong)pIVar2->NavLayer);
      pcVar8 = GetInputSourceName(pIVar2->NavInputSource);
      Text("NavInputSource: %s",pcVar8);
      Text("NavActive: %d, NavVisible: %d",(ulong)((pIVar2->IO).NavActive & 1),
           (ulong)((pIVar2->IO).NavVisible & 1));
      Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X",
           (ulong)pIVar2->NavActivateId,(ulong)pIVar2->NavActivateDownId,
           (ulong)pIVar2->NavActivatePressedId);
      Text("NavActivateFlags: %04X",(ulong)(uint)pIVar2->NavActivateFlags);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",
           (ulong)(pIVar2->NavDisableHighlight & 1),(ulong)(pIVar2->NavDisableMouseHover & 1));
      Text("NavFocusScopeId = 0x%08X",(ulong)pIVar2->NavFocusScopeId);
      if (pIVar2->NavWindowingTarget == (ImGuiWindow *)0x0) {
        local_510 = "NULL";
      }
      else {
        local_510 = pIVar2->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",local_510);
      Unindent(0.0);
      TreePop();
    }
    if (((wrt_rects_names[7][2] & 1U) != 0) || ((wrt_rects_names[7][3] & 1U) != 0)) {
      for (window_1._4_4_ = 0; window_1._4_4_ < (pIVar2->Windows).Size;
          window_1._4_4_ = window_1._4_4_ + 1) {
        ppIVar15 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->Windows,window_1._4_4_);
        pIVar7 = *ppIVar15;
        if ((pIVar7->WasActive & 1U) != 0) {
          r_3.Max = (ImVec2)GetForegroundDrawList(pIVar7);
          if ((wrt_rects_names[7][2] & 1U) != 0) {
            _local_2d0 = ShowMetricsWindow::Funcs::GetWindowRect
                                   (pIVar7,*(int *)(wrt_rects_names[7] + 8));
            ImDrawList::AddRect((ImDrawList *)r_3.Max,(ImVec2 *)local_2d0,&r_3.Min,0xff8000ff,0.0,0,
                                1.0);
          }
          if (((wrt_rects_names[7][3] & 1U) != 0) && ((pIVar7->Flags & 0x1000000U) == 0)) {
            ImFormatString(local_2f8,0x20,"%d",(ulong)(uint)(int)pIVar7->BeginOrderWithinContext);
            local_2fc = GetFontSize();
            this = r_3.Max;
            ImVec2::ImVec2((ImVec2 *)((long)&table_2 + 4),local_2fc,local_2fc);
            local_304 = operator+(&pIVar7->Pos,(ImVec2 *)((long)&table_2 + 4));
            ImDrawList::AddRectFilled((ImDrawList *)this,&pIVar7->Pos,&local_304,0xff6464c8,0.0,0);
            ImDrawList::AddText((ImDrawList *)r_3.Max,&pIVar7->Pos,0xffffffff,local_2f8,(char *)0x0)
            ;
          }
        }
      }
    }
    if ((wrt_rects_names[7][4] & 1U) != 0) {
      for (table_2._0_4_ = 0; iVar4 = (int)table_2,
          iVar6 = ImPool<ImGuiTable>::GetMapSize(&pIVar2->Tables), iVar4 < iVar6;
          table_2._0_4_ = (int)table_2 + 1) {
        table_00 = ImPool<ImGuiTable>::TryGetMapData(&pIVar2->Tables,(int)table_2);
        if ((table_00 != (ImGuiTable *)0x0) &&
           (pIVar2->FrameCount + -1 <= table_00->LastFrameActive)) {
          register0x00000000 = GetForegroundDrawList(table_00->OuterWindow);
          if (*(int *)(wrt_rects_names[7] + 0xc) < 6) {
            _local_34c = ShowMetricsWindow::Funcs::GetTableRect
                                   (table_00,*(int *)(wrt_rects_names[7] + 0xc),-1);
            ImDrawList::AddRect(stack0xfffffffffffffce0,(ImVec2 *)local_34c,&r_5.Min,0xff8000ff,0.0,
                                0,1.0);
          }
          else {
            for (r_4.Max.x = 0.0; (int)r_4.Max.x < table_00->ColumnsCount;
                r_4.Max.x = (float)((int)r_4.Max.x + 1)) {
              _thickness = ShowMetricsWindow::Funcs::GetTableRect
                                     (table_00,*(int *)(wrt_rects_names[7] + 0xc),(int)r_4.Max.x);
              r_5.Max.y = -NAN;
              if ((float)(int)table_00->HoveredColumnBody == r_4.Max.x) {
                r_5.Max.y = -NAN;
              }
              local_530 = 3.0;
              if ((float)(int)table_00->HoveredColumnBody != r_4.Max.x) {
                local_530 = 1.0;
              }
              r_5.Max.x = local_530;
              ImDrawList::AddRect(stack0xfffffffffffffce0,(ImVec2 *)&thickness,&r_4.Min,
                                  (ImU32)r_5.Max.y,0.0,0,local_530);
            }
          }
        }
      }
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    if (cfg->ShowDebugLog)
        ShowDebugLogWindow(&cfg->ShowDebugLog);
    if (cfg->ShowStackTool)
        ShowStackToolWindow(&cfg->ShowStackTool);

    if (!Begin("Dear ImGui Metrics/Debugger", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d visible windows, %d active allocations", io.MetricsRenderWindows, io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent); // Always using last submitted instance
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table_instance->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        bool show_encoding_viewer = TreeNode("UTF-8 Encoding viewer");
        SameLine();
        MetricsHelpMarker("You can also call ImGui::DebugTextEncoding() from your code with a given string to test that your UTF-8 encoding settings are correct.");
        if (show_encoding_viewer)
        {
            static char buf[100] = "";
            SetNextItemWidth(-FLT_MIN);
            InputText("##Text", buf, IM_ARRAYSIZE(buf));
            if (buf[0] != 0)
                DebugTextEncoding(buf);
            TreePop();
        }

        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Checkbox("Show Item Picker", &g.DebugItemPickerActive) && g.DebugItemPickerActive)
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        // Stack Tool is your best friend!
        Checkbox("Show Debug Log", &cfg->ShowDebugLog);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowDebugLogWindow() from your code.");

        // Stack Tool is your best friend!
        Checkbox("Show Stack Tool", &cfg->ShowStackTool);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.TryGetMapData(table_n);
                if (table == NULL || table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    if (TreeNode("Windows", "Windows (%d)", g.Windows.Size))
    {
        //SetNextItemOpen(true, ImGuiCond_Once);
        DebugNodeWindowsList(&g.Windows, "By display order");
        DebugNodeWindowsList(&g.WindowsFocusOrder, "By focus order (root windows)");
        if (TreeNode("By submission order (begin stack)"))
        {
            // Here we display windows in their submitted order/hierarchy, however note that the Begin stack doesn't constitute a Parent<>Child relationship!
            ImVector<ImGuiWindow*>& temp_buffer = g.WindowsTempSortBuffer;
            temp_buffer.resize(0);
            for (int i = 0; i < g.Windows.Size; i++)
                if (g.Windows[i]->LastFrameActive + 1 >= g.FrameCount)
                    temp_buffer.push_back(g.Windows[i]);
            struct Func { static int IMGUI_CDECL WindowComparerByBeginOrder(const void* lhs, const void* rhs) { return ((int)(*(const ImGuiWindow* const *)lhs)->BeginOrderWithinContext - (*(const ImGuiWindow* const*)rhs)->BeginOrderWithinContext); } };
            ImQsort(temp_buffer.Data, (size_t)temp_buffer.Size, sizeof(ImGuiWindow*), Func::WindowComparerByBeginOrder);
            DebugNodeWindowsListByBeginStackParent(temp_buffer.Data, temp_buffer.Size, NULL);
            TreePop();
        }

        TreePop();
    }

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetAliveCount()))
    {
        for (int n = 0; n < g.TabBars.GetMapSize(); n++)
            if (ImGuiTabBar* tab_bar = g.TabBars.TryGetMapData(n))
            {
                PushID(tab_bar);
                DebugNodeTabBar(tab_bar, "TabBar");
                PopID();
            }
        TreePop();
    }

    // Details for Tables
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetAliveCount()))
    {
        for (int n = 0; n < g.Tables.GetMapSize(); n++)
            if (ImGuiTable* table = g.Tables.TryGetMapData(n))
                DebugNodeTable(table);
        TreePop();
    }

    // Details for Fonts
    ImFontAtlas* atlas = g.IO.Fonts;
    if (TreeNode("Fonts", "Fonts (%d)", atlas->Fonts.Size))
    {
        ShowFontAtlas(atlas);
        TreePop();
    }

    // Details for InputText
    if (TreeNode("InputText"))
    {
        DebugNodeInputTextState(&g.InputTextState);
        TreePop();
    }

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredWindow->Root: '%s'", g.HoveredWindow ? g.HoveredWindow->RootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, GetInputSourceName(g.ActiveIdSource));
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");

        int active_id_using_key_input_count = 0;
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            active_id_using_key_input_count += g.ActiveIdUsingKeyInputMask[n] ? 1 : 0;
        Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)", g.ActiveIdUsingMouseWheel, g.ActiveIdUsingNavDirMask, g.ActiveIdUsingNavInputMask, active_id_using_key_input_count);
        Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Not displaying g.HoveredId as it is update mid-frame
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", GetInputSourceName(g.NavInputSource));
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X", g.NavActivateId, g.NavActivateDownId, g.NavActivatePressedId, g.NavActivateInputId);
        Text("NavActivateFlags: %04X", g.NavActivateFlags);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.TryGetMapData(table_n);
            if (table == NULL || table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, 0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}